

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.c
# Opt level: O2

int parg_reorder(int argc,char **argv,char *optstring,parg_option *longopts)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int argc_00;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  parg_state local_68;
  int local_4c;
  parg_state ps;
  
  if (argv == (char **)0x0) {
    __assert_fail("argv != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",
                  0x142,"int parg_reorder(int, char **, const char *, const struct parg_option *)");
  }
  if (optstring == (char *)0x0) {
    __assert_fail("optstring != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",
                  0x143,"int parg_reorder(int, char **, const char *, const struct parg_option *)");
  }
  if (argc < 2) {
    return argc;
  }
  ps.optarg = (char *)0x0;
  ps.optind = 1;
  ps.optopt = 0x3f;
  ps.nextchar = (char *)0x0;
  iVar3 = 1;
  do {
    while( true ) {
      argc_00 = iVar3;
      iVar2 = parg_getopt_long(&ps,argc,argv,optstring,longopts,(int *)0x0);
      iVar3 = ps.optind;
      if ((iVar2 == 0x3a) || (iVar2 == 0x3f)) break;
      if (iVar2 == -1) goto LAB_0010781c;
    }
  } while ((ps.optind < argc) && (argv[ps.optind] != (char *)0x0));
  argc_00 = ps.optind + -1;
LAB_0010781c:
  local_7c = argc_00;
  if (1 < argc_00) {
    local_4c = argc;
LAB_00107832:
    local_68.optarg = (char *)0x0;
    local_68.optind = 1;
    local_68.optopt = 0x3f;
    local_68.nextchar = (char *)0x0;
    do {
      iVar3 = parg_getopt_long(&local_68,argc_00,argv,optstring,longopts,(int *)0x0);
      if (local_68.nextchar == (char *)0x0) break;
    } while (*local_68.nextchar != '\0');
    bVar1 = false;
    local_70 = 1;
LAB_00107884:
    local_74 = local_70;
    do {
      if ((iVar3 == 1) || (iVar3 == -1)) goto LAB_001078c8;
      local_74 = local_68.optind;
      do {
        iVar3 = parg_getopt_long(&local_68,argc_00,argv,optstring,longopts,(int *)0x0);
        if (local_68.nextchar == (char *)0x0) break;
      } while (*local_68.nextchar != '\0');
    } while( true );
  }
LAB_001079ef:
  if (argc_00 < argc) {
    reverse(argv,local_7c,argc_00);
    reverse(argv,local_7c,argc_00 + 1);
    local_7c = local_7c + 1;
  }
  return local_7c;
LAB_001078c8:
  local_78 = local_74;
LAB_001078d0:
  if (iVar3 == 1) {
    local_78 = local_68.optind;
    do {
      iVar3 = parg_getopt_long(&local_68,argc_00,argv,optstring,longopts,(int *)0x0);
      if (local_68.nextchar == (char *)0x0) break;
    } while (*local_68.nextchar != '\0');
    goto LAB_001078d0;
  }
  local_7c = local_78;
  do {
    if ((iVar3 == 1) || (iVar3 == -1)) break;
    local_7c = local_68.optind;
    do {
      iVar3 = parg_getopt_long(&local_68,argc_00,argv,optstring,longopts,(int *)0x0);
      if (local_68.nextchar == (char *)0x0) break;
    } while (*local_68.nextchar != '\0');
  } while( true );
  local_70 = local_7c;
LAB_00107953:
  if (iVar3 == 1) {
    local_70 = local_68.optind;
    do {
      iVar3 = parg_getopt_long(&local_68,argc_00,argv,optstring,longopts,(int *)0x0);
      if (local_68.nextchar == (char *)0x0) break;
    } while (*local_68.nextchar != '\0');
    goto LAB_00107953;
  }
  if (local_78 < local_7c) {
    reverse(argv,local_74,local_78);
    reverse(argv,local_78,local_7c);
    reverse(argv,local_74,local_7c);
    bVar1 = true;
  }
  if (iVar3 == -1) goto code_r0x001079d4;
  goto LAB_00107884;
code_r0x001079d4:
  if (!bVar1) goto code_r0x001079df;
  goto LAB_00107832;
code_r0x001079df:
  local_7c = (local_74 - local_78) + local_7c;
  argc = local_4c;
  goto LAB_001079ef;
}

Assistant:

int
parg_reorder(int argc, char *argv[],
             const char *optstring,
             const struct parg_option *longopts)
{
	struct parg_state ps;
	int lastind;
	int optend;
	int c;

	assert(argv != NULL);
	assert(optstring != NULL);

	if (argc < 2) {
		return argc;
	}

	parg_init(&ps);

	/* Find end of normal arguments */
	do {
		lastind = ps.optind;

		c = parg_getopt_long(&ps, argc, argv, optstring, longopts, NULL);

		/* Check for trailing option with error */
		if ((c == '?' || c == ':') && is_argv_end(&ps, argc, argv)) {
			lastind = ps.optind - 1;
			break;
		}
	} while (c != -1);

	optend = parg_reorder_simple(lastind, argv, optstring, longopts);

	/* Rotate `--` or trailing option with error into position */
	if (lastind < argc) {
		reverse(argv, optend, lastind);
		reverse(argv, optend, lastind + 1);
		++optend;
	}

	return optend;
}